

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

bool __thiscall
QAuthenticatorPrivate::isMethodSupported(QAuthenticatorPrivate *this,QByteArrayView method)

{
  int iVar1;
  void *pvVar2;
  QAuthenticatorPrivate *pQVar3;
  char *b;
  char *__s;
  
  __s = (char *)method.m_size;
  if (0 < (long)this) {
    pvVar2 = memchr(__s,0x20,(size_t)this);
    pQVar3 = (QAuthenticatorPrivate *)((long)pvVar2 - (long)__s);
    if ((QAuthenticatorPrivate *)((long)pvVar2 - (long)__s) ==
        (QAuthenticatorPrivate *)0xffffffffffffffff) {
      pQVar3 = this;
    }
    if (pvVar2 != (void *)0x0) {
      this = pQVar3;
    }
  }
  iVar1 = qstrnicmp(__s,(longlong)this,isMethodSupported::methods[0],5);
  if ((((iVar1 != 0) &&
       (iVar1 = qstrnicmp(__s,(longlong)this,isMethodSupported::methods[1],4), iVar1 != 0)) &&
      (iVar1 = qstrnicmp(__s,(longlong)this,isMethodSupported::methods[2],6), iVar1 != 0)) &&
     (iVar1 = qstrnicmp(__s,(longlong)this,isMethodSupported::methods[3],9), iVar1 != 0)) {
    return false;
  }
  return true;
}

Assistant:

bool QAuthenticatorPrivate::isMethodSupported(QByteArrayView method)
{
    Q_ASSERT(!method.startsWith(' ')); // This should be trimmed during parsing
    auto separator = method.indexOf(' ');
    if (separator != -1)
        method = method.first(separator);
    const auto isSupported = [method](QByteArrayView reference) {
        return method.compare(reference, Qt::CaseInsensitive) == 0;
    };
    static const char methods[][10] = {
        "basic",
        "ntlm",
        "digest",
#if QT_CONFIG(sspi) || QT_CONFIG(gssapi)
        "negotiate",
#endif
    };
    return std::any_of(methods, methods + std::size(methods), isSupported);
}